

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.h
# Opt level: O2

complex<double> CRange::hyperg<double>(complex<double> *a,complex<double> *b,complex<double> *z)

{
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar3;
  double dVar4;
  complex<double> cVar5;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined1 local_58 [8];
  double dStack_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_58 = (undefined1  [8])0x3ff0000000000000;
  dStack_50 = 0.0;
  local_48 = 0.0;
  local_40 = 1.0;
  local_38 = 0.0;
  do {
    local_b8._0_8_ = local_58;
    local_b8._8_8_ = dStack_50;
    local_48 = local_48 + 1.0;
    local_88 = *(double *)a->_M_value + local_48 + -1.0;
    local_80 = *(double *)(a->_M_value + 8) + 0.0;
    local_78 = local_48 + -1.0 + *(double *)b->_M_value;
    dVar3 = *(double *)(b->_M_value + 8) + 0.0;
    local_70 = dVar3;
    std::operator/((complex<double> *)&local_88,(complex<double> *)&local_78);
    local_98._8_8_ = dVar3;
    std::operator*((complex<double> *)local_b8,(complex<double> *)local_98);
    local_68 = *(double *)z->_M_value / local_48;
    dVar4 = *(double *)(z->_M_value + 8) / local_48;
    local_a8._8_8_ = dVar3;
    local_60 = dVar4;
    std::operator*((complex<double> *)local_a8,(complex<double> *)&local_68);
    local_58._4_4_ = extraout_XMM0_Db;
    local_58._0_4_ = extraout_XMM0_Da;
    local_40 = local_40 + (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    local_38 = local_38 + dVar4;
    dStack_50 = dVar4;
    dVar3 = std::abs<double>((complex<double> *)local_58);
    uVar1 = extraout_RAX;
    uVar2 = extraout_RDX;
    if (dVar3 <= 1e-06) break;
    dVar3 = std::abs<double>((complex<double> *)local_b8);
    uVar1 = extraout_RAX_00;
    uVar2 = extraout_RDX_00;
  } while (1e-06 < dVar3);
  cVar5._M_value._8_8_ = uVar2;
  cVar5._M_value._0_8_ = uVar1;
  return (complex<double>)cVar5._M_value;
}

Assistant:

std::complex<T> hyperg(const std::complex<T> &a,
                                                const std::complex<T> &b,
                                                const std::complex<T> &z)
    {
        T dm = 0.0;
        std::complex<T> term(1.0, 0.0);
        std::complex<T> sumterm(1.0, 0.0);
        std::complex<T> previousterm;
        do {
            previousterm = term;
            dm += 1.0;
            std::complex<T> Cm(dm-1.0, 0.0);
            term = previousterm * ((a + Cm)/(b + Cm)) * (z/dm);
            sumterm += term;
        } while( std::abs(term) > 1.0e-6 && std::abs(previousterm) > 1.0e-6 );
        return(sumterm);
    }